

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializeGlobalVars.cpp
# Opt level: O3

void initializeGlobalVars(Module *module,Program *program)

{
  Expr *pEVar1;
  char cVar2;
  RefExpr *pRVar3;
  Expr *pEVar4;
  Module *pMVar5;
  Module *val;
  
  for (pMVar5 = *(Module **)(module + 0x10); pMVar5 != module + 8; pMVar5 = *(Module **)(pMVar5 + 8)
      ) {
    val = pMVar5 + -0x38;
    if (pMVar5 == (Module *)0x0) {
      val = (Module *)0x0;
    }
    if (((Value *)val)[0x10] != (Value)0x0) {
      cVar2 = llvm::GlobalValue::isDeclaration();
      if (cVar2 == '\0') {
        pRVar3 = Program::getGlobalVar(program,(Value *)val);
        pEVar1 = (pRVar3->super_UnaryExpr).expr;
        pEVar4 = createConstantValue(*(Value **)((Value *)val + -0x20),program);
        *(Expr **)&pEVar1[3].kind = pEVar4;
      }
    }
  }
  Program::addPass(program,InitializeGlobalVars);
  return;
}

Assistant:

void initializeGlobalVars(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateConstants));
    assert(program.isPassCompleted(PassType::ComputeGlobalVarsOrder));

    for (const llvm::GlobalVariable& gvar : module->globals()) {
        if (llvm::isa<llvm::Function>(&gvar)) {
            continue;
        }

        if (gvar.hasInitializer()) {
            auto* ref = program.getGlobalVar(&gvar);
            auto* var = llvm::cast<GlobalValue>(ref->expr);
            var->value = createConstantValue(gvar.getInitializer(), program);
        }
    }

    program.addPass(PassType::InitializeGlobalVars);
}